

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O0

void __thiscall
gmlc::networking::TcpConnection::setErrorCall
          (TcpConnection *this,
          function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
          *errorFunc)

{
  ConnectionStates CVar1;
  runtime_error *this_00;
  function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)> *in_RSI
  ;
  long in_RDI;
  function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
  *in_stack_ffffffffffffffe8;
  
  CVar1 = std::atomic<gmlc::networking::TcpConnection::ConnectionStates>::load
                    ((atomic<gmlc::networking::TcpConnection::ConnectionStates> *)(in_RDI + 0x238),
                     seq_cst);
  if (CVar1 == PRESTART) {
    std::function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
    ::operator=(in_RSI,in_stack_ffffffffffffffe8);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"cannot set error callback after socket is started");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TcpConnection::setErrorCall(
    std::function<bool(TcpConnection::pointer, const std::error_code&)>
        errorFunc)
{
    if (state.load() == ConnectionStates::PRESTART) {
        errorCall = std::move(errorFunc);
    } else {
        throw(std::runtime_error(
            "cannot set error callback after socket is started"));
    }
}